

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffoptplt(fitsfile *fptr,char *tempname,int *status)

{
  int iVar1;
  int *in_RDX;
  fitsfile *in_RSI;
  char card [81];
  int ii;
  int nadd;
  int nkeys;
  int tstatus;
  fitsfile *tptr;
  int *in_stack_00003480;
  int in_stack_0000348c;
  char *in_stack_00003490;
  fitsfile **in_stack_00003498;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int local_38;
  uint in_stack_ffffffffffffffd0;
  int iVar2;
  int *in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar2 = 0;
  if (*in_RDX < 1) {
    if ((in_RSI == (fitsfile *)0x0) || ((char)in_RSI->HDUposition == '\0')) {
      local_4 = *in_RDX;
    }
    else {
      ffopen(in_stack_00003498,in_stack_00003490,in_stack_0000348c,in_stack_00003480);
      if (iVar2 == 0) {
        ffmahd(in_RSI,(int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8,
               (int *)(ulong)in_stack_ffffffffffffffd0);
        while (*in_RDX < 1) {
          ffghsp(in_stack_ffffffffffffff78,
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(int *)0x121b83);
          for (local_38 = 1; local_38 <= (int)in_stack_ffffffffffffffd0; local_38 = local_38 + 1) {
            ffgrec(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                   (char *)in_stack_ffffffffffffff68,(int *)0x121baf);
            iVar1 = strncmp(&stack0xffffffffffffff68,"PCOUNT  ",8);
            if ((iVar1 == 0) && (iVar1 = strncmp(&stack0xffffffffffffff81,"    0",5), iVar1 != 0)) {
              strncpy(&stack0xffffffffffffff68,"PCOUNT  =                    0",0x1e);
            }
            ffprec(in_RSI,(char *)in_RDX,in_stack_ffffffffffffffd8);
          }
          ffmrhd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 &in_stack_ffffffffffffff78->HDUposition,
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          ffcrhd(in_stack_ffffffffffffff88,
                 (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        if (*in_RDX == 0x6b) {
          *in_RDX = 0;
        }
        ffclos(in_stack_ffffffffffffff78,
               (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        ffmahd(in_RSI,(int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8,
               (int *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        local_4 = *in_RDX;
      }
      else {
        ffxmsg(in_stack_ffffffffffffff84,(char *)in_stack_ffffffffffffff78);
        fits_execute_template((fitsfile *)card._72_8_,(char *)card._64_8_,(int *)card._56_8_);
        ffmahd(in_RSI,(int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8,
               (int *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        local_4 = *in_RDX;
      }
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffoptplt(fitsfile *fptr,      /* O - FITS file pointer                   */
            const char *tempname, /* I - name of template file               */
            int *status)          /* IO - error status                       */
/*
  open template file and use it to create new file
*/
{
    fitsfile *tptr;
    int tstatus = 0, nkeys, nadd, ii;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (tempname == NULL || *tempname == '\0')     /* no template file? */
        return(*status);

    /* try opening template */
    ffopen(&tptr, (char *) tempname, READONLY, &tstatus); 

    if (tstatus)  /* not a FITS file, so treat it as an ASCII template */
    {
        ffxmsg(2, card);  /* clear the  error message */
        fits_execute_template(fptr, (char *) tempname, status);

        ffmahd(fptr, 1, 0, status);   /* move back to the primary array */
        return(*status);
    }
    else  /* template is a valid FITS file */
    {
        ffmahd(tptr, 1, NULL, status); /* make sure we are at the beginning */
        while (*status <= 0)
        {
           ffghsp(tptr, &nkeys, &nadd, status); /* get no. of keywords */

           for (ii = 1; ii <= nkeys; ii++)   /* copy keywords */
           {
              ffgrec(tptr,  ii, card, status);

              /* must reset the PCOUNT keyword to zero in the new output file */
              if (strncmp(card, "PCOUNT  ",8) == 0) { /* the PCOUNT keyword? */
	         if (strncmp(card+25, "    0", 5)) {  /* non-zero value? */
		    strncpy(card, "PCOUNT  =                    0", 30);
		 }
	      }   
 
              ffprec(fptr, card, status);
           }

           ffmrhd(tptr, 1, 0, status); /* move to next HDU until error */
           ffcrhd(fptr, status);  /* create empty new HDU in output file */
        }

        if (*status == END_OF_FILE)
        {
           *status = 0;              /* expected error condition */
        }
        ffclos(tptr, status);       /* close the template file */
    }

    ffmahd(fptr, 1, 0, status);   /* move to the primary array */
    return(*status);
}